

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

void __thiscall
lf::assemble::UniformFEDofHandler::UniformFEDofHandler
          (UniformFEDofHandler *this,shared_ptr<const_lf::mesh::Mesh> *mesh,dof_map_t *dofmap,
          bool check_edge_orientation)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer ppVar4;
  key_type local_2e9;
  _Self local_2e8;
  iterator map_el_qd;
  _Self local_2d8;
  iterator map_el_tr;
  _Self local_2c8;
  iterator map_el_ed;
  _Self local_2b8;
  iterator map_el_pt;
  iterator map_end;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [399];
  byte local_21;
  dof_map_t *pdStack_20;
  bool check_edge_orientation_local;
  dof_map_t *dofmap_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  UniformFEDofHandler *this_local;
  
  local_21 = check_edge_orientation;
  pdStack_20 = dofmap;
  dofmap_local = (dof_map_t *)mesh;
  mesh_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  DofHandler::DofHandler(&this->super_DofHandler);
  (this->super_DofHandler)._vptr_DofHandler = (_func_int **)&PTR__UniformFEDofHandler_0052e618;
  this->kNodeOrd = 2;
  this->kEdgeOrd = 1;
  this->kCellOrd = 0;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&this->mesh_,mesh);
  this->num_dof_ = 0;
  std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::vector
            (&this->dof_entities_);
  std::array<std::vector<long,_std::allocator<long>_>,_3UL>::array(&this->dofs_);
  (this->num_dofs_)._M_elems[2] = 0;
  (this->num_dofs_)._M_elems[0] = 0;
  (this->num_dofs_)._M_elems[1] = 0;
  this->num_dofs_tria_ = 0;
  this->num_dofs_quad_ = 0;
  this->num_loc_dof_point_ = 0;
  this->num_loc_dof_segment_ = 0;
  this->num_loc_dof_tria_ = 0;
  this->num_loc_dof_quad_ = 0;
  this->check_edge_orientation_ = (bool)(local_21 & 1);
  peVar3 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_);
  iVar2 = (**peVar3->_vptr_Mesh)();
  if (iVar2 == 2) {
    map_el_pt = std::
                map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
                ::end(dofmap);
    map_el_ed._M_node._7_1_ = lf::base::RefEl::kPoint();
    local_2b8._M_node =
         (_Base_ptr)
         std::
         map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         ::find(dofmap,(key_type *)((long)&map_el_ed._M_node + 7));
    bVar1 = std::operator==(&local_2b8,&map_el_pt);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::operator->
                         (&local_2b8);
      this->num_loc_dof_point_ = ppVar4->second;
    }
    map_el_tr._M_node._7_1_ = lf::base::RefEl::kSegment();
    local_2c8._M_node =
         (_Base_ptr)
         std::
         map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         ::find(dofmap,(key_type *)((long)&map_el_tr._M_node + 7));
    bVar1 = std::operator==(&local_2c8,&map_el_pt);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::operator->
                         (&local_2c8);
      this->num_loc_dof_segment_ = ppVar4->second;
    }
    map_el_qd._M_node._7_1_ = lf::base::RefEl::kTria();
    local_2d8._M_node =
         (_Base_ptr)
         std::
         map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         ::find(dofmap,(key_type *)((long)&map_el_qd._M_node + 7));
    bVar1 = std::operator==(&local_2d8,&map_el_pt);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::operator->
                         (&local_2d8);
      this->num_loc_dof_tria_ = ppVar4->second;
    }
    local_2e9.type_ = (RefElType)lf::base::RefEl::kQuad();
    local_2e8._M_node =
         (_Base_ptr)
         std::
         map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         ::find(dofmap,&local_2e9);
    bVar1 = std::operator==(&local_2e8,&map_el_pt);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::operator->
                         (&local_2e8);
      this->num_loc_dof_quad_ = ppVar4->second;
    }
    InitTotalNumDofs(this);
    initIndexArrays(this);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1c0);
  std::operator<<(local_1b0,"Can handle 2D meshes only");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"(mesh_->DimMesh() == 2)",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
             ,&local_209);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1e0,&local_208,0x5c,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
             ,&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"",(allocator<char> *)((long)&map_end._M_node + 7));
  lf::base::AssertionFailed(&local_250,&local_278,0x5c,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&map_end._M_node + 7));
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  abort();
}

Assistant:

UniformFEDofHandler::UniformFEDofHandler(
    std::shared_ptr<const lf::mesh::Mesh> mesh, dof_map_t dofmap,
    bool check_edge_orientation)
    : mesh_(std::move(mesh)),
      num_dofs_(),
      check_edge_orientation_(check_edge_orientation) {
  LF_ASSERT_MSG((mesh_->DimMesh() == 2), "Can handle 2D meshes only");

  // For checking whether a key was found
  auto map_end = dofmap.end();

  // Get no of interior dof specified for nodes
  auto map_el_pt = dofmap.find(lf::base::RefEl::kPoint());
  if (map_el_pt != map_end) {
    num_loc_dof_point_ = map_el_pt->second;
  }

  // Get no of interior dof specified for edges
  auto map_el_ed = dofmap.find(lf::base::RefEl::kSegment());
  if (map_el_ed != map_end) {
    num_loc_dof_segment_ = map_el_ed->second;
  }

  // Get no of interior dof specified for triangles
  auto map_el_tr = dofmap.find(lf::base::RefEl::kTria());
  if (map_el_tr != map_end) {
    num_loc_dof_tria_ = map_el_tr->second;
  }

  // Get no of interior dof specified for quads
  auto map_el_qd = dofmap.find(lf::base::RefEl::kQuad());
  if (map_el_qd != map_end) {
    num_loc_dof_quad_ = map_el_qd->second;
  }

  // If an entity type is not represented in the map, we assume that
  // no shape functions are attached to those entities

  // Initialize total number of shape functions covering an entity.
  InitTotalNumDofs();

  // Initializatin of dof index arrays
  initIndexArrays();
}